

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

bool __thiscall vectorgraphics::TikzPlotter::createTexFile(TikzPlotter *this,path *tex_path)

{
  uint uVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  string local_240 [8];
  long local_238;
  ofstream ofs;
  uint auStack_200 [120];
  
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)&ofs,tex_path,_S_out);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(_ofs + -0x18));
  if ((uVar1 & 5) == 0) {
    poVar2 = std::operator<<((ostream *)&ofs,"\\documentclass[]{standalone}");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"\\usepackage[subpreambles=true]{standalone}");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"\\usepackage{tikz}");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ofs,"\\begin{document}");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string(local_240);
    if (local_238 != 0) {
      poVar2 = std::operator<<((ostream *)&ofs,"\\begin{tikzpicture}");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&ofs,local_240);
      std::__cxx11::string::~string(local_240);
      poVar2 = std::operator<<((ostream *)&ofs,"\\end{tikzpicture}");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&ofs,"\\end{document}");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::close();
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error in createTexFile: opening output file at "
                            );
    pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,tex_path);
    std::endl<char,std::char_traits<char>>(pbVar3);
  }
  std::ofstream::~ofstream(&ofs);
  return (uVar1 & 5) == 0;
}

Assistant:

bool TikzPlotter::createTexFile(std::filesystem::path tex_path) const {
    std::ofstream ofs(tex_path);

    if (!ofs) {
      std::cout << "Error in createTexFile: opening output file at " << tex_path << std::endl;
      return false;
    }

    ofs << R"(\documentclass[]{standalone})" << std::endl;
    ofs << R"(\usepackage[subpreambles=true]{standalone})" << std::endl;
    ofs << R"(\usepackage{tikz})" << std::endl;
    ofs << R"(\begin{document})" << std::endl;

    if (content.str().size() != 0) {
      ofs << R"(\begin{tikzpicture})" << std::endl;

      ofs << content.str();

      ofs << R"(\end{tikzpicture})" << std::endl;
    }
    ofs << R"(\end{document})" << std::endl;

    ofs.close();
    return true;
  }